

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInterface.cpp
# Opt level: O0

HighsStatus __thiscall
Highs::extractIis(Highs *this,HighsInt *num_iis_col,HighsInt *num_iis_row,HighsInt *iis_col_index,
                 HighsInt *iis_row_index,HighsInt *iis_col_bound,HighsInt *iis_row_bound)

{
  size_type sVar1;
  reference pvVar2;
  long in_RCX;
  int *in_RDX;
  int *in_RSI;
  long in_RDI;
  long in_R8;
  long in_R9;
  long in_stack_00000008;
  HighsInt iRow;
  HighsInt iCol;
  undefined4 local_38;
  undefined4 local_34;
  
  sVar1 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x11b0));
  *in_RSI = (int)sVar1;
  sVar1 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x11c8));
  *in_RDX = (int)sVar1;
  if ((in_RCX != 0) || (in_R9 != 0)) {
    for (local_34 = 0; local_34 < *in_RSI; local_34 = local_34 + 1) {
      if (in_RCX != 0) {
        pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x11b0),(long)local_34);
        *(value_type *)(in_RCX + (long)local_34 * 4) = *pvVar2;
      }
      if (in_R9 != 0) {
        pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x11e0),(long)local_34);
        *(value_type *)(in_R9 + (long)local_34 * 4) = *pvVar2;
      }
    }
  }
  if ((in_R8 != 0) || (in_stack_00000008 != 0)) {
    for (local_38 = 0; local_38 < *in_RDX; local_38 = local_38 + 1) {
      if (in_R8 != 0) {
        pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x11c8),(long)local_38);
        *(value_type *)(in_R8 + (long)local_38 * 4) = *pvVar2;
      }
      if (in_stack_00000008 != 0) {
        pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x11f8),(long)local_38);
        *(value_type *)(in_stack_00000008 + (long)local_38 * 4) = *pvVar2;
      }
    }
  }
  return kOk;
}

Assistant:

HighsStatus Highs::extractIis(HighsInt& num_iis_col, HighsInt& num_iis_row,
                              HighsInt* iis_col_index, HighsInt* iis_row_index,
                              HighsInt* iis_col_bound,
                              HighsInt* iis_row_bound) {
  assert(this->iis_.valid_);
  num_iis_col = this->iis_.col_index_.size();
  num_iis_row = this->iis_.row_index_.size();
  if (iis_col_index || iis_col_bound) {
    for (HighsInt iCol = 0; iCol < num_iis_col; iCol++) {
      if (iis_col_index) iis_col_index[iCol] = this->iis_.col_index_[iCol];
      if (iis_col_bound) iis_col_bound[iCol] = this->iis_.col_bound_[iCol];
    }
  }
  if (iis_row_index || iis_row_bound) {
    for (HighsInt iRow = 0; iRow < num_iis_row; iRow++) {
      if (iis_row_index) iis_row_index[iRow] = this->iis_.row_index_[iRow];
      if (iis_row_bound) iis_row_bound[iRow] = this->iis_.row_bound_[iRow];
    }
  }
  return HighsStatus::kOk;
}